

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O2

ExprPtr __thiscall mathiu::impl::operator-(impl *this,ExprPtr *lhs,ExprPtr *rhs)

{
  Expr *value;
  Expr *value_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  impl *piVar2;
  bool bVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  anon_class_8_1_ba1d745d f;
  ExprPtr EVar4;
  impl aiStackY_138 [4];
  Integer in_stack_fffffffffffffecc;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  __shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> local_128;
  impl *local_110;
  ExprPtr local_108;
  ExprPtr local_f8;
  __shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> local_e8;
  App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>
  local_d8;
  ExprPtr *local_b0;
  ContextT context;
  App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>
  local_60;
  __shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *local_38;
  
  value = (lhs->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  value_00 = (rhs->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_60.mUnary = (AsPointer<int> *)&matchit::impl::asPointer<int>;
  local_60.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::deref;
  local_60.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>,_false>
  ._M_head_impl.mPattern = 0;
  local_60.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_60.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mPattern = true;
  local_d8.mUnary = (AsPointer<int> *)&matchit::impl::asPointer<int>;
  local_d8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::deref;
  local_d8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>,_false>
  ._M_head_impl.mPattern = 0;
  local_d8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_d8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mPattern = true;
  local_128._M_ptr = (element_type *)0x0;
  local_128._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  context.mMemHolder._M_elems[3].super__Variant_base<std::monostate,_const_int_*,_bool>.
  super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
  super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
  super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
  super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
  super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._M_u =
       (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0;
  context.mMemHolder._M_elems[3].super__Variant_base<std::monostate,_const_int_*,_bool>.
  super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
  super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
  super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
  super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
  super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._M_index = '\0';
  context.mMemHolder._M_elems[3].super__Variant_base<std::monostate,_const_int_*,_bool>.
  super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
  super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
  super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
  super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
  super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._9_7_ = 0;
  context.mMemHolder._M_elems[2].super__Variant_base<std::monostate,_const_int_*,_bool>.
  super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
  super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
  super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
  super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
  super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._M_u =
       (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0;
  context.mMemHolder._M_elems[2].super__Variant_base<std::monostate,_const_int_*,_bool>.
  super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
  super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
  super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
  super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
  super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._M_index = '\0';
  context.mMemHolder._M_elems[2].super__Variant_base<std::monostate,_const_int_*,_bool>.
  super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
  super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
  super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
  super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
  super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._9_7_ = 0;
  context.mMemHolder._M_elems[1].super__Variant_base<std::monostate,_const_int_*,_bool>.
  super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
  super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
  super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
  super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
  super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._M_u =
       (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0;
  context.mMemHolder._M_elems[1].super__Variant_base<std::monostate,_const_int_*,_bool>.
  super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
  super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
  super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
  super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
  super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._M_index = '\0';
  context.mMemHolder._M_elems[1].super__Variant_base<std::monostate,_const_int_*,_bool>.
  super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
  super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
  super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
  super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
  super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._9_7_ = 0;
  context.mMemHolder._M_elems[0].super__Variant_base<std::monostate,_const_int_*,_bool>.
  super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
  super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
  super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
  super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
  super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._M_u =
       (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0;
  context.mMemHolder._M_elems[0].super__Variant_base<std::monostate,_const_int_*,_bool>.
  super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
  super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
  super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
  super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
  super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._M_index = '\0';
  context.mMemHolder._M_elems[0].super__Variant_base<std::monostate,_const_int_*,_bool>.
  super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
  super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
  super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
  super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
  super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._9_7_ = 0;
  context.mSize = 0;
  local_110 = this;
  local_b0 = rhs;
  local_38 = &lhs->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
  matchit::impl::Context<const_int_*,_bool,_const_int_*,_bool>::Context(&context);
  bVar3 = matchit::impl::
          matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,int>>>,matchit::impl::Context<int_const*,bool,int_const*,bool>>
                    (value_00,&local_60,1,&context);
  if (bVar3) {
    std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)aiStackY_138,
               local_38);
  }
  else {
    context.mMemHolder._M_elems[3].super__Variant_base<std::monostate,_const_int_*,_bool>.
    super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
    super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
    super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
    super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
    super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._M_u =
         (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0;
    context.mMemHolder._M_elems[3].super__Variant_base<std::monostate,_const_int_*,_bool>.
    super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
    super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
    super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
    super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
    super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._M_index = '\0';
    context.mMemHolder._M_elems[3].super__Variant_base<std::monostate,_const_int_*,_bool>.
    super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
    super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
    super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
    super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
    super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._9_7_ = 0;
    context.mMemHolder._M_elems[2].super__Variant_base<std::monostate,_const_int_*,_bool>.
    super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
    super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
    super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
    super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
    super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._M_u =
         (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0;
    context.mMemHolder._M_elems[2].super__Variant_base<std::monostate,_const_int_*,_bool>.
    super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
    super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
    super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
    super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
    super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._M_index = '\0';
    context.mMemHolder._M_elems[2].super__Variant_base<std::monostate,_const_int_*,_bool>.
    super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
    super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
    super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
    super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
    super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._9_7_ = 0;
    context.mMemHolder._M_elems[1].super__Variant_base<std::monostate,_const_int_*,_bool>.
    super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
    super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
    super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
    super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
    super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._M_u =
         (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0;
    context.mMemHolder._M_elems[1].super__Variant_base<std::monostate,_const_int_*,_bool>.
    super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
    super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
    super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
    super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
    super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._M_index = '\0';
    context.mMemHolder._M_elems[1].super__Variant_base<std::monostate,_const_int_*,_bool>.
    super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
    super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
    super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
    super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
    super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._9_7_ = 0;
    context.mMemHolder._M_elems[0].super__Variant_base<std::monostate,_const_int_*,_bool>.
    super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
    super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
    super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
    super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
    super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._M_u =
         (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0;
    context.mMemHolder._M_elems[0].super__Variant_base<std::monostate,_const_int_*,_bool>.
    super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
    super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
    super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
    super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
    super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._M_index = '\0';
    context.mMemHolder._M_elems[0].super__Variant_base<std::monostate,_const_int_*,_bool>.
    super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
    super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
    super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
    super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
    super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._9_7_ = 0;
    context.mSize = 0;
    matchit::impl::Context<const_int_*,_bool,_const_int_*,_bool>::Context(&context);
    bVar3 = matchit::impl::
            matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,int>>>,matchit::impl::Context<int_const*,bool,int_const*,bool>>
                      (value,&local_d8,1,&context);
    if (!bVar3) {
      context.mMemHolder._M_elems[3].super__Variant_base<std::monostate,_const_int_*,_bool>.
      super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
      super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
      super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
      super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
      super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._M_u =
           (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0;
      context.mMemHolder._M_elems[3].super__Variant_base<std::monostate,_const_int_*,_bool>.
      super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
      super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
      super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
      super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
      super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._M_index = '\0';
      context.mMemHolder._M_elems[3].super__Variant_base<std::monostate,_const_int_*,_bool>.
      super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
      super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
      super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
      super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
      super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._9_7_ = 0;
      context.mMemHolder._M_elems[2].super__Variant_base<std::monostate,_const_int_*,_bool>.
      super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
      super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
      super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
      super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
      super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._M_u =
           (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0;
      context.mMemHolder._M_elems[2].super__Variant_base<std::monostate,_const_int_*,_bool>.
      super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
      super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
      super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
      super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
      super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._M_index = '\0';
      context.mMemHolder._M_elems[2].super__Variant_base<std::monostate,_const_int_*,_bool>.
      super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
      super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
      super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
      super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
      super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._9_7_ = 0;
      context.mMemHolder._M_elems[1].super__Variant_base<std::monostate,_const_int_*,_bool>.
      super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
      super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
      super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
      super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
      super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._M_u =
           (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0;
      context.mMemHolder._M_elems[1].super__Variant_base<std::monostate,_const_int_*,_bool>.
      super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
      super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
      super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
      super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
      super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._M_index = '\0';
      context.mMemHolder._M_elems[1].super__Variant_base<std::monostate,_const_int_*,_bool>.
      super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
      super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
      super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
      super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
      super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._9_7_ = 0;
      context.mMemHolder._M_elems[0].super__Variant_base<std::monostate,_const_int_*,_bool>.
      super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
      super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
      super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
      super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
      super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._M_u =
           (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0;
      context.mMemHolder._M_elems[0].super__Variant_base<std::monostate,_const_int_*,_bool>.
      super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
      super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
      super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
      super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
      super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._M_index = '\0';
      context.mMemHolder._M_elems[0].super__Variant_base<std::monostate,_const_int_*,_bool>.
      super__Move_assign_alias<std::monostate,_const_int_*,_bool>.
      super__Copy_assign_alias<std::monostate,_const_int_*,_bool>.
      super__Move_ctor_alias<std::monostate,_const_int_*,_bool>.
      super__Copy_ctor_alias<std::monostate,_const_int_*,_bool>.
      super__Variant_storage_alias<std::monostate,_const_int_*,_bool>._9_7_ = 0;
      context.mSize = 0;
      matchit::impl::Context<const_int_*,_bool,_const_int_*,_bool>::Context(&context);
      integer(in_stack_fffffffffffffecc);
      operator-((impl *)&local_f8,&local_108);
      operator*(aiStackY_138,&local_f8,rhs);
      operator+((impl *)&local_e8,lhs,(ExprPtr *)aiStackY_138);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_130);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_f8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_108.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_128,&local_e8);
      this_00 = &local_e8._M_refcount;
      goto LAB_00169dfe;
    }
    operator-(aiStackY_138,local_b0);
  }
  std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_128,
             (__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)aiStackY_138);
  this_00 = &local_130;
LAB_00169dfe:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  piVar2 = local_110;
  _Var1._M_pi = local_128._M_refcount._M_pi;
  local_128._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(element_type **)local_110 = local_128._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_110 + 8) = _Var1._M_pi;
  local_128._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128._M_refcount);
  EVar4.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar4.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)piVar2;
  return (ExprPtr)EVar4.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr operator-(ExprPtr const &lhs, ExprPtr const &rhs)
        {
            return match(*lhs, *rhs)
            (
                // basic identity transformation
                pattern | ds(_, as<Integer>(0)) = expr(lhs),
                pattern | ds(as<Integer>(0), _) = [&] { return -rhs; },
                pattern | _ = [&] { return lhs + -1_i * rhs; }
            );
        }